

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O3

void __thiscall chrono::ChSolverPMINRES::ArchiveIN(ChSolverPMINRES *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChSolverPMINRES>(marchive);
  ChIterativeSolverVI::ArchiveIN(&this->super_ChIterativeSolverVI,marchive);
  local_30 = &this->grad_diffstep;
  local_38 = "grad_diffstep";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->rel_tolerance;
  local_38 = "rel_tolerance";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&(this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond;
  local_38 = "m_use_precond";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChSolverPMINRES::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSolverPMINRES>();
    // deserialize parent class
    ChIterativeSolverVI::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(grad_diffstep);
    marchive >> CHNVP(rel_tolerance);
    marchive >> CHNVP(m_use_precond);
}